

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

void __thiscall cp::PlanFootprints::calcNextWaistPose(PlanFootprints *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  Packet2d b_zw;
  undefined1 auVar13 [16];
  double dVar14;
  
  dVar2 = *(double *)(this + 0x300);
  dVar1 = cos(dVar2 * 0.5);
  dVar2 = sin(dVar2 * 0.5);
  dVar11 = dVar2 * 0.0;
  dVar3 = dVar11 * 0.0;
  dVar7 = dVar3 - dVar2 * 0.0;
  auVar9._8_4_ = SUB84(dVar7,0);
  auVar9._0_8_ = dVar3 - dVar1 * 0.0;
  auVar9._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar9 = auVar9 ^ ZEXT816(0x8000000000000000);
  dVar8 = auVar9._0_8_ + dVar2 * 0.0 + dVar11;
  dVar10 = auVar9._8_8_ + dVar1 * 0.0 + dVar11;
  dVar7 = dVar2 * 0.0 + dVar3;
  auVar13._8_4_ = SUB84(dVar7,0);
  auVar13._0_8_ = dVar1 * 0.0 + dVar3;
  auVar13._12_4_ = (int)((ulong)dVar7 >> 0x20);
  dVar12 = SUB168(auVar13 ^ _DAT_0010a050,0) + (dVar2 - dVar11 * 0.0);
  dVar14 = SUB168(auVar13 ^ _DAT_0010a050,8) + (dVar1 - dVar11 * 0.0);
  dVar2 = *(double *)(this + 0x1f0);
  dVar1 = *(double *)(this + 0x1f8);
  dVar3 = *(double *)(this + 0x200);
  dVar7 = *(double *)(this + 0x208);
  dVar11 = dVar3 * dVar8 - dVar2 * dVar12;
  auVar5._8_4_ = SUB84(dVar11,0);
  auVar5._0_8_ = dVar3 * dVar10 - dVar2 * dVar14;
  auVar5._12_4_ = (int)((ulong)dVar11 >> 0x20);
  auVar5 = auVar5 ^ ZEXT816(0x8000000000000000);
  dVar4 = auVar5._0_8_ + dVar1 * dVar12 + dVar7 * dVar8;
  dVar6 = auVar5._8_8_ + dVar1 * dVar14 + dVar7 * dVar10;
  dVar11 = -(dVar2 * dVar8 + dVar3 * dVar12) + (dVar7 * dVar14 - dVar1 * dVar10);
  dVar2 = dVar2 * dVar10 + dVar3 * dVar14 + (dVar7 * dVar12 - dVar1 * dVar8);
  dVar1 = dVar4 * *(double *)(this + 0x2f0) - dVar6 * *(double *)(this + 0x2e8);
  dVar1 = dVar1 + dVar1;
  dVar3 = *(double *)(this + 0x2f8) * dVar6 - *(double *)(this + 0x2f0) * dVar2;
  dVar7 = *(double *)(this + 0x2e8) * dVar2 - *(double *)(this + 0x2f8) * dVar4;
  dVar3 = dVar3 + dVar3;
  dVar7 = dVar7 + dVar7;
  *(double *)(this + 0x1d0) =
       dVar11 * dVar3 + *(double *)(this + 0x2e8) + (dVar1 * dVar6 - dVar7 * dVar2) +
       *(double *)(this + 0x1d0);
  *(double *)(this + 0x1d8) =
       dVar11 * dVar7 + *(double *)(this + 0x2f0) + (dVar3 * dVar2 - dVar1 * dVar4) +
       *(double *)(this + 0x1d8);
  *(undefined8 *)(this + 0x1e0) = 0;
  *(double *)(this + 0x1f0) = dVar4;
  *(double *)(this + 0x1f8) = dVar6;
  *(double *)(this + 0x200) = dVar2;
  *(double *)(this + 0x208) = dVar11;
  return;
}

Assistant:

void PlanFootprints::calcNextWaistPose() {
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);
}